

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld_sampler.cpp
# Opt level: O1

void __thiscall LDSampler::LDSampler(LDSampler *this,uint32_t sp,uint32_t block_dim)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  
  uVar2 = sp - 1 >> 1 | sp - 1;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar3 = (uVar2 >> 0x10 | uVar2) + 1;
  uVar2 = 8;
  if (8 < uVar3) {
    uVar2 = uVar3;
  }
  this->spp = uVar2;
  this->block_dim = block_dim;
  this->samples_taken = 0;
  (this->start).first = 0;
  (this->start).second = block_dim;
  (this->current).first = 0;
  (this->current).second = 0;
  (this->distrib)._M_param = (param_type)0xffffffff00000000;
  if (sp < 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Warning: LDSampler only supports taking 8 or more samples per pixel,",0x44);
    pcVar5 = " will take ";
    lVar4 = 0xb;
  }
  else {
    if (uVar2 == sp) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Warning: LDSampler only takes power of 2 samples per pixel, rounded up to",0x49);
    pcVar5 = " take ";
    lVar4 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"spp\n",4);
  return;
}

Assistant:

LDSampler::LDSampler(uint32_t sp, uint32_t block_dim) : spp(std::max(round_up_pow2(sp), uint32_t{8})),
	block_dim(block_dim), samples_taken(0), start({0, block_dim}), current({0, 0})
{
	if (sp < 8){
		std::cout << "Warning: LDSampler only supports taking 8 or more samples per pixel,"
			<< " will take " << spp << "spp\n";
	}
	else if (sp != spp){
		std::cout << "Warning: LDSampler only takes power of 2 samples per pixel, rounded up to"
			<< " take " << spp << "spp\n";
	}
}